

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1513.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLcode CVar2;
  undefined8 uVar3;
  long lVar4;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  int res;
  CURL *curl;
  char *URL_local;
  
  ec_1 = CURLE_OK;
  CVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (CVar2 != CURLE_OK) {
    uVar3 = curl_easy_strerror(CVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                  ,0x35,CVar2,uVar3);
    ec_1 = CVar2;
  }
  if (ec_1 == CURLE_OK) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                    ,0x37);
      ec_1 = CURLE_QUIC_CONNECT_ERROR|CURLE_OPERATION_TIMEDOUT;
    }
    if (ec_1 == CURLE_OK) {
      CVar2 = curl_easy_setopt(lVar4,0x2712,URL);
      uVar1 = _stderr;
      if (CVar2 != CURLE_OK) {
        uVar3 = curl_easy_strerror(CVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                      ,0x39,CVar2,uVar3);
        ec_1 = CVar2;
      }
      if (ec_1 == CURLE_OK) {
        CVar2 = curl_easy_setopt(lVar4,0xd,7);
        uVar1 = _stderr;
        if (CVar2 != CURLE_OK) {
          uVar3 = curl_easy_strerror(CVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                        ,0x3a,CVar2,uVar3);
          ec_1 = CVar2;
        }
        if (ec_1 == CURLE_OK) {
          CVar2 = curl_easy_setopt(lVar4,99,1);
          uVar1 = _stderr;
          if (CVar2 != CURLE_OK) {
            uVar3 = curl_easy_strerror(CVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                          ,0x3b,CVar2,uVar3);
            ec_1 = CVar2;
          }
          if (ec_1 == CURLE_OK) {
            CVar2 = curl_easy_setopt(lVar4,0x4e58,progressKiller);
            uVar1 = _stderr;
            if (CVar2 != CURLE_OK) {
              uVar3 = curl_easy_strerror(CVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                            ,0x3c,CVar2,uVar3);
              ec_1 = CVar2;
            }
            if (ec_1 == CURLE_OK) {
              CVar2 = curl_easy_setopt(lVar4,0x2749,0);
              uVar1 = _stderr;
              if (CVar2 != CURLE_OK) {
                uVar3 = curl_easy_strerror(CVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                              ,0x3d,CVar2,uVar3);
                ec_1 = CVar2;
              }
              if (ec_1 == CURLE_OK) {
                CVar2 = curl_easy_setopt(lVar4,0x2b,0);
                uVar1 = _stderr;
                if (CVar2 != CURLE_OK) {
                  uVar3 = curl_easy_strerror(CVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1513.c"
                                ,0x3e,CVar2,uVar3);
                  ec_1 = CVar2;
                }
                if (ec_1 == CURLE_OK) {
                  ec_1 = curl_easy_perform(lVar4);
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = ec_1;
  }
  else {
    URL_local._4_4_ = ec_1;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_TIMEOUT, (long)7);
  easy_setopt(curl, CURLOPT_NOSIGNAL, (long)1);
  easy_setopt(curl, CURLOPT_PROGRESSFUNCTION, progressKiller);
  easy_setopt(curl, CURLOPT_PROGRESSDATA, NULL);
  easy_setopt(curl, CURLOPT_NOPROGRESS, (long)0);

  res = curl_easy_perform(curl);

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}